

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O1

ExtPrivkey * __thiscall
cfd::core::DescriptorKeyReference::GetExtPrivkey
          (ExtPrivkey *__return_storage_ptr__,DescriptorKeyReference *this)

{
  CfdException *this_00;
  undefined1 local_40 [32];
  
  if (this->key_type_ == kDescriptorKeyBip32Priv) {
    Extkey::Extkey(&__return_storage_ptr__->super_Extkey,&(this->extprivkey_).super_Extkey);
    return __return_storage_ptr__;
  }
  local_40._0_8_ = "cfdcore_descriptor.cpp";
  local_40._8_4_ = 0x1a4;
  local_40._16_8_ = "GetExtPrivkey";
  logger::log<>((CfdSourceLocation *)local_40,kCfdLogLevelWarning,
                "Failed to GetExtPrivkey. unsupported key type.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._0_8_ = local_40 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"GetExtPrivkey unsupported key type.","");
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_40);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ExtPrivkey DescriptorKeyReference::GetExtPrivkey() const {
  if (key_type_ == DescriptorKeyType::kDescriptorKeyBip32Priv) {
    return extprivkey_;
  }
  warn(CFD_LOG_SOURCE, "Failed to GetExtPrivkey. unsupported key type.");
  throw CfdException(
      CfdError::kCfdIllegalArgumentError,
      "GetExtPrivkey unsupported key type.");
}